

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  undefined8 uVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  nk_rect bounds;
  nk_rect nVar7;
  nk_rect cursor;
  nk_rect empty_north;
  nk_rect empty_south;
  float local_e0;
  nk_rect local_c8;
  float local_ac;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  nk_rect local_88;
  undefined1 local_78 [16];
  nk_rect local_60;
  nk_rect local_50;
  nk_rect local_40;
  
  local_c8 = scroll;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5331,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_scrollbar *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5332,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5333,
                  "float nk_do_scrollbarv(nk_flags *, struct nk_command_buffer *, struct nk_rect, int, float, float, float, float, const struct nk_style_scrollbar *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  local_c8.w = scroll.w;
  local_50.w = 1.0;
  if (1.0 <= local_c8.w) {
    local_50.w = local_c8.w;
  }
  local_c8.h = scroll.h;
  local_c8._0_8_ = scroll._0_8_;
  uVar1 = local_c8._0_8_;
  local_c8.w = local_50.w;
  fVar4 = 0.0;
  if (0.0 <= local_c8.h) {
    fVar4 = local_c8.h;
  }
  fVar3 = 0.0;
  local_c8.h = fVar4;
  nVar7 = local_c8;
  if (fVar4 < target) {
    if (style->show_buttons != 0) {
      local_78 = ZEXT416((uint)fVar4);
      local_ac = fVar4 - (local_50.w + local_50.w);
      fVar4 = step;
      if (button_pixel_inc <= step) {
        fVar4 = button_pixel_inc;
      }
      local_c8.y = scroll.y;
      fVar3 = local_c8.y;
      local_a8 = ZEXT416((uint)local_50.w);
      local_c8.x = (float)uVar1;
      local_c8.y = SUB84(uVar1,4);
      local_88.x = local_c8.x;
      local_88.y = local_c8.y;
      local_88.w = local_c8.w;
      local_88.h = local_c8.h;
      bounds.h = local_50.w;
      bounds.w = local_50.w;
      local_c8.x = (float)uVar1;
      local_c8.y = SUB84(uVar1,4);
      bounds.x = local_c8.x;
      bounds.y = local_c8.y;
      local_c8 = nVar7;
      local_98 = local_50.w;
      fStack_94 = local_50.w;
      fStack_90 = local_50.w;
      fStack_8c = local_50.w;
      iVar2 = nk_do_button_symbol((nk_flags *)&local_50,out,bounds,style->dec_symbol,
                                  NK_BUTTON_REPEATER,&style->dec_button,in,font);
      local_e0 = offset;
      if (iVar2 != 0) {
        local_e0 = offset - fVar4;
      }
      fVar5 = 0.0;
      if (0.0 <= local_ac) {
        fVar5 = local_ac;
      }
      nVar7.h = fStack_94;
      nVar7.w = local_98;
      nVar7.y = ((float)local_78._0_4_ + fVar3) - (float)local_a8._0_4_;
      nVar7.x = local_88.x;
      iVar2 = nk_do_button_symbol((nk_flags *)&local_50,out,nVar7,style->inc_symbol,
                                  NK_BUTTON_REPEATER,&style->inc_button,in,font);
      if (iVar2 != 0) {
        local_e0 = local_e0 + fVar4;
      }
      local_c8.y = fVar3 + (float)local_a8._0_4_;
      local_c8.h = fVar5;
      offset = local_e0;
      local_50.w = (float)local_a8._0_4_;
    }
    fVar4 = local_c8.h;
    if (local_c8.h <= step) {
      step = local_c8.h;
    }
    if (target - local_c8.h <= offset) {
      offset = target - local_c8.h;
    }
    fVar3 = 0.0;
    if (0.0 <= offset) {
      fVar3 = offset;
    }
    fVar5 = style->border;
    fVar6 = (style->padding).y;
    local_60.y = (fVar3 / target) * local_c8.h + local_c8.y + fVar5 + fVar6;
    fVar6 = (local_c8.h / target) * local_c8.h - (fVar6 + fVar6 + fVar5 + fVar5);
    local_60.h = 0.0;
    if (0.0 <= fVar6) {
      local_60.h = fVar6;
    }
    fVar6 = (style->padding).x;
    local_60.x = fVar5 + local_c8.x + fVar6;
    local_60.w = local_50.w - (fVar6 + fVar6 + fVar5 + fVar5);
    local_50.x = local_c8.x;
    local_50.y = local_c8.y;
    local_40.y = local_60.h + local_60.y;
    local_a8._0_4_ = local_c8.y;
    local_50.h = 0.0;
    if (0.0 <= local_60.y - local_c8.y) {
      local_50.h = local_60.y - local_c8.y;
    }
    local_40.x = local_c8.x;
    fVar5 = (local_c8.h + local_c8.y) - local_40.y;
    local_40.h = 0.0;
    if (0.0 <= fVar5) {
      local_40.h = fVar5;
    }
    local_40.w = local_50.w;
    fVar3 = nk_scrollbar_behavior
                      (state,in,has_scrolling,&local_c8,&local_60,&local_50,&local_40,fVar3,target,
                       step,NK_VERTICAL);
    local_60.y = (fVar3 / target) * fVar4 + (float)local_a8._0_4_ + style->border_cursor +
                 (style->padding).y;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_scrollbar(out,*state,style,&local_c8,&local_60);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return fVar3;
}

Assistant:

NK_LIB float
nk_do_scrollbarv(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
    float offset, float target, float step, float button_pixel_inc,
    const struct nk_style_scrollbar *style, struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect empty_north;
    struct nk_rect empty_south;
    struct nk_rect cursor;

    float scroll_step;
    float scroll_offset;
    float scroll_off;
    float scroll_ratio;

    NK_ASSERT(out);
    NK_ASSERT(style);
    NK_ASSERT(state);
    if (!out || !style) return 0;

    scroll.w = NK_MAX(scroll.w, 1);
    scroll.h = NK_MAX(scroll.h, 0);
    if (target <= scroll.h) return 0;

    /* optional scrollbar buttons */
    if (style->show_buttons) {
        nk_flags ws;
        float scroll_h;
        struct nk_rect button;

        button.x = scroll.x;
        button.w = scroll.w;
        button.h = scroll.w;

        scroll_h = NK_MAX(scroll.h - 2 * button.h,0);
        scroll_step = NK_MIN(step, button_pixel_inc);

        /* decrement button */
        button.y = scroll.y;
        if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
            NK_BUTTON_REPEATER, &style->dec_button, in, font))
            offset = offset - scroll_step;

        /* increment button */
        button.y = scroll.y + scroll.h - button.h;
        if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
            NK_BUTTON_REPEATER, &style->inc_button, in, font))
            offset = offset + scroll_step;

        scroll.y = scroll.y + button.h;
        scroll.h = scroll_h;
    }

    /* calculate scrollbar constants */
    scroll_step = NK_MIN(step, scroll.h);
    scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
    scroll_ratio = scroll.h / target;
    scroll_off = scroll_offset / target;

    /* calculate scrollbar cursor bounds */
    cursor.h = NK_MAX((scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y), 0);
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
    cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
    cursor.x = scroll.x + style->border + style->padding.x;

    /* calculate empty space around cursor */
    empty_north.x = scroll.x;
    empty_north.y = scroll.y;
    empty_north.w = scroll.w;
    empty_north.h = NK_MAX(cursor.y - scroll.y, 0);

    empty_south.x = scroll.x;
    empty_south.y = cursor.y + cursor.h;
    empty_south.w = scroll.w;
    empty_south.h = NK_MAX((scroll.y + scroll.h) - (cursor.y + cursor.h), 0);

    /* update scrollbar */
    scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
        &empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
    scroll_off = scroll_offset / target;
    cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

    /* draw scrollbar */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return scroll_offset;
}